

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O1

int __thiscall MetaCommand::GetValueAsInt(MetaCommand *this,string *optionName,string *fieldName)

{
  pointer pcVar1;
  pointer pOVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pFVar5;
  undefined1 *__s2;
  int iVar6;
  pointer pFVar7;
  pointer pOVar8;
  bool bVar9;
  string fieldname;
  int local_6c;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  __s2 = local_50;
  pOVar8 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar8 != pOVar2) {
    sVar3 = optionName->_M_string_length;
    do {
      sVar4 = (pOVar8->name)._M_string_length;
      if (sVar4 == sVar3) {
        if (sVar4 != 0) {
          iVar6 = bcmp((pOVar8->name)._M_dataplus._M_p,(optionName->_M_dataplus)._M_p,sVar4);
          if (iVar6 != 0) goto LAB_0011a2d2;
        }
        pFVar5 = (pOVar8->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pFVar7 = (pOVar8->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start; bVar9 = pFVar7 != pFVar5, bVar9;
            pFVar7 = pFVar7 + 1) {
          sVar4 = (pFVar7->name)._M_string_length;
          if (sVar4 == local_48) {
            if (sVar4 != 0) {
              iVar6 = bcmp((pFVar7->name)._M_dataplus._M_p,__s2,sVar4);
              if (iVar6 != 0) goto LAB_0011a2ac;
            }
            local_6c = atoi((pFVar7->value)._M_dataplus._M_p);
            break;
          }
LAB_0011a2ac:
        }
        if (bVar9) goto LAB_0011a2e3;
      }
LAB_0011a2d2:
      pOVar8 = pOVar8 + 1;
    } while (pOVar8 != pOVar2);
  }
  local_6c = 0;
LAB_0011a2e3:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return local_6c;
}

Assistant:

int MetaCommand::GetValueAsInt(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return atoi((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}